

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O0

int __thiscall
Fl_Tree_Item_Array::reparent
          (Fl_Tree_Item_Array *this,Fl_Tree_Item *item,Fl_Tree_Item *newparent,int pos)

{
  int iVar1;
  int local_30;
  int t;
  int pos_local;
  Fl_Tree_Item *newparent_local;
  Fl_Tree_Item *item_local;
  Fl_Tree_Item_Array *this_local;
  
  if ((pos < 0) || (this->_total < pos)) {
    this_local._4_4_ = -1;
  }
  else {
    enlarge(this,1);
    this->_total = this->_total + 1;
    iVar1 = this->_total;
    while (local_30 = iVar1 + -1, pos < local_30) {
      this->_items[local_30] = this->_items[iVar1 + -2];
      iVar1 = local_30;
    }
    this->_items[pos] = item;
    Fl_Tree_Item::parent(this->_items[pos],newparent);
    Fl_Tree_Item::update_prev_next(this->_items[pos],pos);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree_Item_Array::reparent(Fl_Tree_Item *item, Fl_Tree_Item* newparent, int pos) {
  if ( pos<0 || pos>_total ) return -1;
  // Add item to new parent
  enlarge(1);
  _total += 1;
  for ( int t=_total-1; t>pos; --t )    // shuffle array to make room for new entry
    _items[t] = _items[t-1];
  _items[pos] = item;                   // insert new entry
  // Attach to new parent and siblings
  _items[pos]->parent(newparent);       // reparent (update_prev_next() needs this)
  _items[pos]->update_prev_next(pos);   // find new siblings
  return 0;
}